

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SPIRFunction * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::allocate<spirv_cross::SPIRFunction&>
          (ObjectPool<spirv_cross::SPIRFunction> *this,SPIRFunction *p)

{
  Vector<spirv_cross::SPIRFunction_*> *this_00;
  SPIRFunction *pSVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  SPIRFunction *ptr;
  SPIRFunction *local_40;
  SPIRFunction *local_38;
  
  this_00 = &this->vacants;
  sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size;
  if (sVar2 == 0) {
    uVar3 = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    pSVar1 = (SPIRFunction *)malloc(uVar3 * 800);
    if (pSVar1 == (SPIRFunction *)0x0) {
      return (SPIRFunction *)0x0;
    }
    local_38 = pSVar1;
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      local_40 = pSVar1;
      SmallVector<spirv_cross::SPIRFunction_*,_0UL>::push_back(this_00,&local_40);
      pSVar1 = pSVar1 + 1;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRFunction,spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRFunction*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRFunction,spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>,8ul>
                *)&this->memory,&local_38);
    sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size;
  }
  pSVar1 = (this_00->super_VectorView<spirv_cross::SPIRFunction_*>).ptr[sVar2 - 1];
  SmallVector<spirv_cross::SPIRFunction_*,_0UL>::pop_back(this_00);
  SPIRFunction::SPIRFunction(pSVar1,p);
  return pSVar1;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}